

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::setComment(Value *this,char *comment,CommentPlacement placement)

{
  undefined8 *puVar1;
  
  if (this->comments_ == (CommentInfo *)0x0) {
    puVar1 = (undefined8 *)operator_new__(0x20);
    *puVar1 = 3;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    this->comments_ = (CommentInfo *)(puVar1 + 1);
  }
  CommentInfo::setComment(this->comments_ + placement,comment);
  return;
}

Assistant:

void Value::setComment(const char* comment, CommentPlacement placement) {
  if (!comments_)
    comments_ = new CommentInfo[numberOfCommentPlacement];
  comments_[placement].setComment(comment);
}